

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args_2;
  BlockCoverageEventSyntax *pBVar1;
  DeepCloneVisitor visitor;
  Token local_60;
  Token local_50;
  Token local_40;
  
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x28),(BumpAllocator *)__child_stack);
  args_2 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x38),(DeepCloneVisitor *)&local_60,
                      (BumpAllocator *)__child_stack);
  local_60 = parsing::Token::deepClone((Token *)(__fn + 0x40),(BumpAllocator *)__child_stack);
  pBVar1 = BumpAllocator::
           emplace<slang::syntax::BlockCoverageEventSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::BlockEventExpressionSyntax&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,&local_40,&local_50,
                      (BlockEventExpressionSyntax *)args_2,&local_60);
  return (int)pBVar1;
}

Assistant:

static SyntaxNode* clone(const BlockCoverageEventSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<BlockCoverageEventSyntax>(
        node.atat.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone<BlockEventExpressionSyntax>(*node.expr, alloc),
        node.closeParen.deepClone(alloc)
    );
}